

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerSafe::SetActiveDataset
          (Error *__return_storage_ptr__,CommissionerSafe *this,ActiveOperationalDataset *aDataset)

{
  promise<ot::commissioner::Error> local_80;
  function<void_(ot::commissioner::Error)> local_60;
  anon_class_8_1_ba1d6e0d local_40;
  anon_class_8_1_ba1d6e0d wait;
  promise<ot::commissioner::Error> pro;
  ActiveOperationalDataset *aDataset_local;
  CommissionerSafe *this_local;
  
  std::promise<ot::commissioner::Error>::promise((promise<ot::commissioner::Error> *)&wait);
  local_40.pro = (promise<ot::commissioner::Error> *)&wait;
  std::function<void(ot::commissioner::Error)>::
  function<ot::commissioner::CommissionerSafe::SetActiveDataset(ot::commissioner::ActiveOperationalDataset_const&)::__0&,void>
            ((function<void(ot::commissioner::Error)> *)&local_60,&local_40);
  (*(this->super_Commissioner)._vptr_Commissioner[0x1d])(this,&local_60,aDataset);
  std::function<void_(ot::commissioner::Error)>::~function(&local_60);
  std::promise<ot::commissioner::Error>::get_future(&local_80);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&local_80);
  std::future<ot::commissioner::Error>::~future((future<ot::commissioner::Error> *)&local_80);
  std::promise<ot::commissioner::Error>::~promise((promise<ot::commissioner::Error> *)&wait);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::SetActiveDataset(const ActiveOperationalDataset &aDataset)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error aError) { pro.set_value(aError); };

    SetActiveDataset(wait, aDataset);
    return pro.get_future().get();
}